

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

reverse_iterator * __thiscall
immutable::transient_vector<int,_true,_5>::rend
          (reverse_iterator *__return_storage_ptr__,transient_vector<int,_true,_5> *this)

{
  iterator local_30;
  
  begin(&local_30,this);
  (__return_storage_ptr__->current)._impl.ptr = local_30._impl.ptr;
  if (local_30._impl.ptr != (rrb<int,_true,_5> *)0x0) {
    LOCK();
    ((local_30._impl.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
         ((local_30._impl.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  (__return_storage_ptr__->current)._cursor.
  super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Head_base<0UL,_const_int_*,_false>._M_head_impl =
       local_30._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
       super__Head_base<0UL,_const_int_*,_false>._M_head_impl;
  (__return_storage_ptr__->current)._index = local_30._index;
  *(undefined4 *)&(__return_storage_ptr__->current).field_0xc = local_30._12_4_;
  (__return_storage_ptr__->current)._cursor.
  super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> =
       local_30._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
       super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>;
  ref<immutable::rrb<int,_true,_5>_>::~ref(&local_30._impl);
  return __return_storage_ptr__;
}

Assistant:

reverse_iterator rend() const
        {
        return reverse_iterator{ begin() };
        }